

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void NodeSingletonEvent(anynode *Any,dataid Cmd,nodemodule *Module)

{
  long lVar1;
  long *plVar2;
  array List;
  array local_20;
  
  NodeEnumSingletonsEx(Any,&local_20,Module);
  plVar2 = (long *)local_20._Begin;
  if (7 < local_20._Used) {
    do {
      lVar1 = *plVar2;
      if (lVar1 == 0) {
        __assert_fail("(const void*)(*i)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0xb13,"void NodeSingletonEvent(anynode *, dataid, nodemodule *)");
      }
      (**(code **)(*(long *)(lVar1 + 8) + 0x20))(lVar1,Cmd,0,0);
      plVar2 = plVar2 + 1;
    } while (plVar2 != (long *)((local_20._Used & 0xfffffffffffffff8) + (long)local_20._Begin));
  }
  ArrayClear(&local_20);
  return;
}

Assistant:

void NodeSingletonEvent(anynode* Any, dataid Cmd, nodemodule* Module)
{
    array List;
    node** i;

    NodeEnumSingletonsEx(Any,&List,Module);

    for (i=ARRAYBEGIN(List,node*);i!=ARRAYEND(List,node*);++i)
        Node_Trigger(*i,Cmd);

    ArrayClear(&List);
}